

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddCount.c
# Opt level: O0

int cuddZddCountStep(DdNode *P,st__table *table,DdNode *base,DdNode *empty)

{
  int iVar1;
  int iVar2;
  int *local_40;
  int *dummy;
  DdNode *pDStack_30;
  int res;
  DdNode *empty_local;
  DdNode *base_local;
  st__table *table_local;
  DdNode *P_local;
  
  if (P == empty) {
    P_local._4_4_ = 0;
  }
  else if (P == base) {
    P_local._4_4_ = 1;
  }
  else {
    pDStack_30 = empty;
    empty_local = base;
    base_local = (DdNode *)table;
    table_local = (st__table *)P;
    iVar1 = st__lookup(table,(char *)P,(char **)&local_40);
    if (iVar1 == 0) {
      iVar1 = cuddZddCountStep(*(DdNode **)&table_local->max_density,(st__table *)base_local,
                               empty_local,pDStack_30);
      iVar2 = cuddZddCountStep(*(DdNode **)&table_local->num_bins,(st__table *)base_local,
                               empty_local,pDStack_30);
      dummy._4_4_ = iVar1 + iVar2;
      local_40 = (int *)malloc(4);
      if (local_40 == (int *)0x0) {
        P_local._4_4_ = -1;
      }
      else {
        *local_40 = dummy._4_4_;
        iVar1 = st__insert((st__table *)base_local,(char *)table_local,(char *)local_40);
        if (iVar1 == -10000) {
          if (local_40 != (int *)0x0) {
            free(local_40);
          }
          P_local._4_4_ = -1;
        }
        else {
          P_local._4_4_ = dummy._4_4_;
        }
      }
    }
    else {
      P_local._4_4_ = *local_40;
    }
  }
  return P_local._4_4_;
}

Assistant:

static int
cuddZddCountStep(
  DdNode * P,
  st__table * table,
  DdNode * base,
  DdNode * empty)
{
    int         res;
    int         *dummy;

    if (P == empty)
        return(0);
    if (P == base)
        return(1);

    /* Check cache. */
    if ( st__lookup(table, (const char *)P, (char **)&dummy)) {
        res = *dummy;
        return(res);
    }

    res = cuddZddCountStep(cuddE(P), table, base, empty) +
        cuddZddCountStep(cuddT(P), table, base, empty);

    dummy = ABC_ALLOC(int, 1);
    if (dummy == NULL) {
        return(CUDD_OUT_OF_MEM);
    }
    *dummy = res;
    if ( st__insert(table, (char *)P, (char *)dummy) == st__OUT_OF_MEM) {
        ABC_FREE(dummy);
        return(CUDD_OUT_OF_MEM);
    }

    return(res);

}